

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O3

int __thiscall Saturation::SaturationAlgorithm::init(SaturationAlgorithm *this,EVP_PKEY_CTX *ctx)

{
  List<Kernel::Unit_*> **ppLVar1;
  undefined1 auVar2 [8];
  Entry *pEVar3;
  Unit *pUVar4;
  Entry *pEVar5;
  int iVar6;
  undefined1 auVar7 [8];
  ulong uVar8;
  Clause *cl;
  undefined1 local_90 [8];
  undefined1 local_88 [8];
  Entry *pEStack_80;
  Unit *local_78;
  Entry *pEStack_70;
  Unit *local_68;
  Entry *local_60;
  Unit *local_58;
  Entry *local_50;
  Unit *local_48;
  Entry *pEStack_40;
  Unit *local_38;
  
  if (*(char *)(Lib::env + 0x16b2) == '\x01') {
    local_78 = (Unit *)0x0;
    pEStack_70 = (Entry *)0x0;
    local_88 = (undefined1  [8])0x0;
    pEStack_80 = (Entry *)0x0;
    Kernel::Problem::clauseIterator((Problem *)local_90);
    Lib::Stack<Kernel::Clause*>::loadFromIterator<Lib::VirtualIterator<Kernel::Clause*>>
              ((Stack<Kernel::Clause*> *)local_88,(VirtualIterator<Kernel::Clause_*> *)local_90);
    if (local_90 != (undefined1  [8])0x0) {
      ppLVar1 = (List<Kernel::Unit_*> **)((long)local_90 + 8);
      *(int *)ppLVar1 = *(int *)ppLVar1 + -1;
      if (*(int *)ppLVar1 == 0) {
        (**(code **)&(*(Unit **)local_90)->_inference)();
      }
    }
    Shell::Shuffling::shuffleArray<Lib::Stack<Kernel::Clause*>>
              ((Stack<Kernel::Clause_*> *)local_88,
               (uint)((ulong)((long)local_78 - (long)pEStack_80) >> 3));
    pEVar5 = pEStack_70;
    pUVar4 = local_78;
    pEVar3 = pEStack_80;
    auVar2 = local_88;
    local_38 = (Unit *)((long)local_78 - (long)pEStack_80 >> 3);
    local_48 = (Unit *)0x0;
    pEStack_40 = (Entry *)0x0;
    local_88 = (undefined1  [8])0x0;
    pEStack_70 = (Entry *)0x0;
    pEStack_80 = (Entry *)0x0;
    local_78 = (Unit *)0x0;
    local_68 = (Unit *)auVar2;
    local_58 = pUVar4;
    local_50 = pEVar5;
    local_60 = pEVar3;
    auVar7 = (undefined1  [8])::operator_new(0x48,8);
    ((UnitList *)((long)auVar7 + 0x40))->_head = local_38;
    ((UnitList *)((long)auVar7 + 0x30))->_head = local_48;
    ((UnitList *)((long)auVar7 + 0x30))->_tail = (List<Kernel::Unit_*> *)pEStack_40;
    ((UnitList *)auVar7)->_head = (Unit *)&PTR__ProxyIterator_00b35dd0;
    ((UnitList *)((long)auVar7 + 0x10))->_head = (Unit *)auVar2;
    ((UnitList *)((long)auVar7 + 0x20))->_head = pUVar4;
    ((UnitList *)((long)auVar7 + 0x20))->_tail = (List<Kernel::Unit_*> *)pEVar5;
    ((UnitList *)((long)auVar7 + 0x10))->_tail = (List<Kernel::Unit_*> *)pEVar3;
    *(undefined4 *)&((UnitList *)auVar7)->_tail = 1;
    if (pEStack_80 != (Entry *)0x0) {
      uVar8 = (long)local_88 * 8 + 0xfU & 0xfffffffffffffff0;
      if (uVar8 == 0) {
        pEStack_80->field_0 =
             (anon_union_4_2_6ecd024b_for_Entry_0)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        pEStack_80->_key = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pEStack_80;
      }
      else if (uVar8 < 0x11) {
        pEStack_80->field_0 =
             (anon_union_4_2_6ecd024b_for_Entry_0)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
        pEStack_80->_key = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pEStack_80;
      }
      else if (uVar8 < 0x19) {
        pEStack_80->field_0 =
             (anon_union_4_2_6ecd024b_for_Entry_0)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
        pEStack_80->_key = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pEStack_80;
      }
      else if (uVar8 < 0x21) {
        pEStack_80->field_0 =
             (anon_union_4_2_6ecd024b_for_Entry_0)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        pEStack_80->_key = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pEStack_80;
      }
      else if (uVar8 < 0x31) {
        pEStack_80->field_0 =
             (anon_union_4_2_6ecd024b_for_Entry_0)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        pEStack_80->_key = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pEStack_80;
      }
      else if (uVar8 < 0x41) {
        pEStack_80->field_0 =
             (anon_union_4_2_6ecd024b_for_Entry_0)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        pEStack_80->_key = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pEStack_80;
      }
      else {
        operator_delete(pEStack_80,0x10);
      }
    }
  }
  else {
    Kernel::Problem::clauseIterator((Problem *)local_88);
    auVar7 = local_88;
    if ((local_88 != (undefined1  [8])0x0) && (*(int *)((long)local_88 + 8) == 0)) {
      (**(code **)&(*(Unit **)local_88)->_inference)(local_88);
    }
  }
  while( true ) {
    iVar6 = (**(code **)&(((UnitList *)auVar7)->_head->_inference).field_0x8)(auVar7);
    if ((char)iVar6 == '\0') break;
    cl = (Clause *)(*(code *)(((UnitList *)auVar7)->_head->_inference)._splits)(auVar7);
    addInputClause(this,cl);
  }
  if (this->_splitter != (Splitter *)0x0) {
    iVar6 = Splitter::init(this->_splitter,(EVP_PKEY_CTX *)this);
  }
  if (this->_consFinder != (ConsequenceFinder *)0x0) {
    iVar6 = ConsequenceFinder::init(this->_consFinder,(EVP_PKEY_CTX *)this);
  }
  if (this->_symEl != (SymElOutput *)0x0) {
    iVar6 = SymElOutput::init(this->_symEl,(EVP_PKEY_CTX *)this);
  }
  ppLVar1 = &((UnitList *)auVar7)->_tail;
  *(int *)ppLVar1 = *(int *)ppLVar1 + -1;
  if (*(int *)ppLVar1 == 0) {
    iVar6 = (**(code **)&((UnitList *)auVar7)->_head->_inference)(auVar7);
  }
  return iVar6;
}

Assistant:

void SaturationAlgorithm::init()
{
  ClauseIterator toAdd;

  if (env.options->randomTraversals()) {
    TIME_TRACE(TimeTrace::SHUFFLING);

    Stack<Clause *> aux;
    aux.loadFromIterator(_prb.clauseIterator());
    Shuffling::shuffleArray(aux,aux.size());
    toAdd = pvi(arrayIter(std::move(aux)));
  } else {
    toAdd = _prb.clauseIterator();
  }

  while (toAdd.hasNext()) {
    Clause* cl = toAdd.next();
    addInputClause(cl);
  }

  if (_splitter) {
    _splitter->init(this);
  }
  if (_consFinder) {
    _consFinder->init(this);
  }
  if (_symEl) {
    _symEl->init(this);
  }
}